

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::cmComputeLinkDepends
          (cmComputeLinkDepends *this,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_header *p_Var1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  cmTargetLinkLibraryType cVar3;
  cmLocalGenerator *pcVar4;
  cmake *this_01;
  bool bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  allocator<char> local_99;
  string local_98 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->Config)._M_dataplus._M_p = (pointer)&(this->Config).field_2;
  (this->Config)._M_string_length = 0;
  (this->Config).field_2._M_local_buf[0] = '\0';
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->FinalLinkEntries).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalLinkEntries).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FinalLinkEntries).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EntryList).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EntryList).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EntryList).
  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>,void>
            (&this->BFSQueue);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>,void>
            (&this->SharedDepQueue);
  p_Var1 = &(this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedDepFollowed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InferredDependSets).
  super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InferredDependSets).
  super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InferredDependSets).
  super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->OldWrongConfigItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Target = target;
  this->Makefile = target->Target->Makefile;
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar2 = pcVar4->GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  this->CMakeInstance = pcVar2->CMakeInstance;
  bVar5 = config->_M_string_length == 0;
  this->HasConfig = !bVar5;
  if (bVar5) {
    local_98[0]._M_dataplus._M_p = (pointer)&local_98[0].field_2;
    local_98[0]._M_string_length = 0;
    local_98[0].field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)local_98,(string *)config);
  }
  std::__cxx11::string::_M_assign((string *)&this->Config);
  std::__cxx11::string::~string((string *)local_98);
  this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_(&local_48,this_01);
  cVar3 = CMP0003_ComputeLinkType(&this->Config,&local_48);
  this->LinkType = cVar3;
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"CMAKE_LINK_DEPENDS_DEBUG_MODE",&local_99);
  bVar5 = cmMakefile::IsOn(this_00,local_98);
  this->DebugMode = bVar5;
  std::__cxx11::string::~string((string *)local_98);
  this->OldLinkDirMode = false;
  this->CCG = (cmComputeComponentGraph *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

cmComputeLinkDepends::cmComputeLinkDepends(const cmGeneratorTarget* target,
                                           const std::string& config)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->Target->GetMakefile();
  this->GlobalGenerator =
    this->Target->GetLocalGenerator()->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();

  // The configuration being linked.
  this->HasConfig = !config.empty();
  this->Config = (this->HasConfig) ? config : std::string();
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  this->LinkType = CMP0003_ComputeLinkType(this->Config, debugConfigs);

  // Enable debug mode if requested.
  this->DebugMode = this->Makefile->IsOn("CMAKE_LINK_DEPENDS_DEBUG_MODE");

  // Assume no compatibility until set.
  this->OldLinkDirMode = false;

  // No computation has been done.
  this->CCG = nullptr;
}